

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_world.cc
# Opt level: O0

void sptk::world::rdft(int n,int isgn,double *a,int *ip,double *w)

{
  double dVar1;
  int *in_RCX;
  double *in_RDX;
  int in_ESI;
  int in_EDI;
  long in_R8;
  int nc;
  int nw;
  double xi;
  int in_stack_ffffffffffffffcc;
  int nc_00;
  int iVar2;
  double *in_stack_ffffffffffffffd8;
  int n_00;
  
  iVar2 = *in_RCX;
  nc_00 = in_RCX[1];
  n_00 = (int)((ulong)in_R8 >> 0x20);
  if (in_ESI < 0) {
    in_RDX[1] = (*in_RDX - in_RDX[1]) * 0.5;
    *in_RDX = *in_RDX - in_RDX[1];
    if (in_EDI < 5) {
      if (in_EDI == 4) {
        cftbsub(n_00,in_stack_ffffffffffffffd8,(int *)CONCAT44(iVar2,nc_00),
                in_stack_ffffffffffffffcc,(double *)0x14268e);
      }
    }
    else {
      rftbsub(in_EDI,in_RDX,nc_00,(double *)(in_R8 + (long)iVar2 * 8));
      cftbsub((int)((ulong)in_R8 >> 0x20),in_stack_ffffffffffffffd8,(int *)CONCAT44(iVar2,nc_00),
              in_stack_ffffffffffffffcc,(double *)0x142669);
    }
  }
  else {
    if (in_EDI < 5) {
      if (in_EDI == 4) {
        cftfsub(n_00,in_stack_ffffffffffffffd8,(int *)CONCAT44(iVar2,nc_00),
                in_stack_ffffffffffffffcc,(double *)0x142598);
      }
    }
    else {
      cftfsub(n_00,in_stack_ffffffffffffffd8,(int *)CONCAT44(iVar2,nc_00),in_stack_ffffffffffffffcc,
              (double *)0x142550);
      rftfsub(in_EDI,in_RDX,nc_00,(double *)(in_R8 + (long)iVar2 * 8));
    }
    dVar1 = *in_RDX;
    *in_RDX = in_RDX[1] + *in_RDX;
    in_RDX[1] = dVar1 - in_RDX[1];
  }
  return;
}

Assistant:

void rdft(int n, int isgn, double *a, int *ip, double *w) {
#if 0
  void cftfsub(int n, double *a, int *ip, int nw, double *w);
  void cftbsub(int n, double *a, int *ip, int nw, double *w);
  void rftfsub(int n, double *a, int nc, double *c);
  void rftbsub(int n, double *a, int nc, double *c);
#endif
  double xi;

  int nw = ip[0];
  int nc = ip[1];

  if (isgn >= 0) {
    if (n > 4) {
      cftfsub(n, a, ip, nw, w);
      rftfsub(n, a, nc, w + nw);
    } else if (n == 4) {
      cftfsub(n, a, ip, nw, w);
    }
    xi = a[0] - a[1];
    a[0] += a[1];
    a[1] = xi;
  } else {
    a[1] = 0.5 * (a[0] - a[1]);
    a[0] -= a[1];
    if (n > 4) {
      rftbsub(n, a, nc, w + nw);
      cftbsub(n, a, ip, nw, w);
    } else if (n == 4) {
      cftbsub(n, a, ip, nw, w);
    }
  }
}